

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  long lVar2;
  cmMakefile *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer pbVar6;
  char *__s;
  cmInstallScriptGenerator *pcVar7;
  cmGlobalGenerator *this_01;
  bool exclude_from_all;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  string script;
  string component;
  string local_a8;
  cmInstallCommand *local_88;
  char *local_80;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  cmMakefile *local_38;
  
  local_78[0] = local_68;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_88 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar10 = false;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar6) {
    exclude_from_all = false;
  }
  else {
    iVar5 = 0;
    uVar8 = 0;
    exclude_from_all = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar6 + uVar8));
      if ((iVar4 == 0) &&
         (uVar8 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)local_78);
        iVar5 = iVar5 + 1;
        uVar8 = uVar8 + 1;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar8));
      if (iVar4 == 0) {
        exclude_from_all = true;
      }
      uVar8 = uVar8 + 1;
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
    ;
    bVar10 = 1 < iVar5;
  }
  if (bVar10) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    cmCommand::SetError(&local_88->super_cmCommand,&local_a8);
LAB_002f1586:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar11 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish == pbVar6;
    bVar10 = !bVar11;
    if (bVar11) {
      bVar3 = false;
      bVar11 = false;
    }
    else {
      lVar9 = 0;
      uVar8 = 0;
      bVar3 = false;
      bVar11 = false;
      do {
        iVar5 = std::__cxx11::string::compare((char *)((long)&(pbVar6->_M_dataplus)._M_p + lVar9));
        if (iVar5 == 0) {
          bVar11 = true;
LAB_002f1784:
          bVar3 = false;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar9));
          if (iVar5 == 0) {
            bVar3 = true;
            bVar11 = false;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar9));
            if (iVar5 == 0) {
              bVar11 = false;
              goto LAB_002f1784;
            }
            if (bVar11) {
              pbVar6 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              lVar2 = *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar9);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,lVar2,
                         *(long *)((long)&pbVar6->_M_string_length + lVar9) + lVar2);
              bVar11 = cmsys::SystemTools::FileIsFullPath(local_a8._M_dataplus._M_p);
              if (!bVar11) {
                __s = cmMakefile::GetCurrentSourceDirectory((local_88->super_cmCommand).Makefile);
                local_80 = (char *)local_a8._M_string_length;
                strlen(__s);
                std::__cxx11::string::_M_replace((ulong)&local_a8,0,local_80,(ulong)__s);
                std::__cxx11::string::append((char *)&local_a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_a8,
                           *(ulong *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar9));
              }
              bVar11 = cmsys::SystemTools::FileIsDirectory(&local_a8);
              local_80 = (char *)CONCAT71(local_80._1_7_,bVar11);
              if (bVar11) {
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,"given a directory as value of SCRIPT argument.","");
                cmCommand::SetError(&local_88->super_cmCommand,&local_58);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                local_38 = (local_88->super_cmCommand).Makefile;
                pcVar7 = (cmInstallScriptGenerator *)operator_new(0xe0);
                cmInstallScriptGenerator::cmInstallScriptGenerator
                          (pcVar7,local_a8._M_dataplus._M_p,false,(char *)local_78[0],
                           exclude_from_all);
                cmMakefile::AddInstallGenerator(local_38,(cmInstallGenerator *)pcVar7);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar11 = false;
              if ((char)local_80 != '\0') break;
            }
            else if (bVar3) {
              pbVar6 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              this_00 = (local_88->super_cmCommand).Makefile;
              pcVar7 = (cmInstallScriptGenerator *)operator_new(0xe0);
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar7,*(char **)((long)&(pbVar6->_M_dataplus)._M_p + lVar9),true,
                         (char *)local_78[0],exclude_from_all);
              cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)pcVar7);
              goto LAB_002f1784;
            }
          }
        }
        uVar8 = uVar8 + 1;
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x20;
        bVar10 = uVar8 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >>
                                5);
      } while (bVar10);
    }
    if (!bVar10) {
      if (bVar11) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"given no value for SCRIPT argument.","");
        cmCommand::SetError(&local_88->super_cmCommand,&local_a8);
      }
      else {
        if (!bVar3) {
          this_01 = cmMakefile::GetGlobalGenerator((local_88->super_cmCommand).Makefile);
          bVar10 = true;
          cmGlobalGenerator::AddInstallComponent(this_01,(char *)local_78[0]);
          goto LAB_002f183e;
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"given no value for CODE argument.","");
        cmCommand::SetError(&local_88->super_cmCommand,&local_a8);
      }
      goto LAB_002f1586;
    }
  }
  bVar10 = false;
LAB_002f183e:
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return bVar10;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    }
  }

  if (componentCount > 1) {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
                   "signature of the INSTALL command. "
                   "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (args[i] == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (args[i] == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = args[i];
      if (!cmSystemTools::FileIsFullPath(script.c_str())) {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += args[i];
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        script.c_str(), false, component.c_str(), exclude_from_all));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = args[i];
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        code.c_str(), true, component.c_str(), exclude_from_all));
    }
  }

  if (doing_script) {
    this->SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    this->SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component.c_str());

  return true;
}